

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O2

bool duckdb_snappy::InternalUncompressAllTags<duckdb_snappy::SnappyArrayWriter>
               (SnappyDecompressor *decompressor,SnappyArrayWriter *writer,uint32_t compressed_len,
               uint32_t uncompressed_len)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  
  uVar1 = (ulong)compressed_len;
  writer->op_limit_ = writer->op_ + uVar1;
  uVar2 = 0x3f;
  if (uVar1 < 0x3f) {
    uVar2 = uVar1;
  }
  writer->op_limit_min_slop_ = writer->op_ + uVar1 + -uVar2;
  SnappyDecompressor::DecompressAllTags<duckdb_snappy::SnappyArrayWriter>(decompressor,writer);
  if (decompressor->eof_ == true) {
    bVar3 = writer->op_ == writer->op_limit_;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

static bool InternalUncompressAllTags(SnappyDecompressor* decompressor,
                                      Writer* writer, uint32_t compressed_len,
                                      uint32_t uncompressed_len) {
    int token = 0;
  Report(token, "snappy_uncompress", compressed_len, uncompressed_len);

  writer->SetExpectedLength(uncompressed_len);

  // Process the entire input
  decompressor->DecompressAllTags(writer);
  writer->Flush();
  return (decompressor->eof() && writer->CheckLength());
}